

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

int __thiscall mkvmuxer::Segment::WriteFramesAll(Segment *this)

{
  Cluster *this_00;
  Frame **ppFVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  Frame *pFVar6;
  
  if (this->frames_ == (Frame **)0x0) {
    return 0;
  }
  iVar4 = -1;
  if ((0 < (long)this->cluster_list_size_) &&
     (this_00 = this->cluster_list_[(long)this->cluster_list_size_ + -1], this_00 != (Cluster *)0x0)
     ) {
    iVar4 = this->frames_size_;
    if (0 < iVar4) {
      lVar5 = 0;
      do {
        ppFVar1 = this->frames_;
        pFVar6 = ppFVar1[lVar5];
        if (pFVar6->discard_padding_ != 0) {
          this->doc_type_version_ = 4;
        }
        bVar3 = Cluster::QueueOrWriteFrame(this_00,pFVar6);
        if (bVar3) {
          pFVar6 = ppFVar1[lVar5];
          if ((this->new_cuepoint_ == true) && (this->cues_track_ == pFVar6->track_number_)) {
            bVar3 = AddCuePoint(this,pFVar6->timestamp_,this->cues_track_);
            pFVar6 = ppFVar1[lVar5];
            if (!bVar3) goto LAB_0014f820;
          }
          uVar2 = pFVar6->timestamp_;
          if (this->last_timestamp_ < uVar2) {
            this->last_timestamp_ = uVar2;
            this->last_track_timestamp_[pFVar6->track_number_ - 1] = uVar2;
          }
          Frame::~Frame(pFVar6);
          operator_delete(pFVar6);
          ppFVar1[lVar5] = (Frame *)0x0;
        }
        else {
          pFVar6 = ppFVar1[lVar5];
LAB_0014f820:
          if (pFVar6 != (Frame *)0x0) {
            Frame::~Frame(pFVar6);
          }
          operator_delete(pFVar6);
        }
        lVar5 = lVar5 + 1;
        iVar4 = this->frames_size_;
      } while (lVar5 < iVar4);
    }
    this->frames_size_ = 0;
  }
  return iVar4;
}

Assistant:

int Segment::WriteFramesAll() {
  if (frames_ == NULL)
    return 0;

  if (cluster_list_size_ < 1)
    return -1;

  Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];

  if (!cluster)
    return -1;

  for (int32_t i = 0; i < frames_size_; ++i) {
    Frame*& frame = frames_[i];
    // TODO(jzern/vigneshv): using Segment::AddGenericFrame here would limit the
    // places where |doc_type_version_| needs to be updated.
    if (frame->discard_padding() != 0)
      doc_type_version_ = 4;
    if (!cluster->AddFrame(frame)) {
      delete frame;
      continue;
    }

    if (new_cuepoint_ && cues_track_ == frame->track_number()) {
      if (!AddCuePoint(frame->timestamp(), cues_track_)) {
        delete frame;
        continue;
      }
    }

    if (frame->timestamp() > last_timestamp_) {
      last_timestamp_ = frame->timestamp();
      last_track_timestamp_[frame->track_number() - 1] = frame->timestamp();
    }

    delete frame;
    frame = NULL;
  }

  const int result = frames_size_;
  frames_size_ = 0;

  return result;
}